

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O0

double TestSpectra::PowLawFit_spectrum(double xMin,double xMax,double expo)

{
  RandomGen *this;
  double __y;
  double dVar1;
  undefined8 local_38;
  double xTry;
  double yMin;
  double yMax;
  double expo_local;
  double xMax_local;
  double xMin_local;
  
  __y = expo + 1.0;
  xMax_local = xMin;
  if (0.0 <= __y) {
    yMin = pow(xMax,__y);
    xTry = pow(xMin,__y);
  }
  else {
    if (xMin <= 0.0) {
      xMax_local = 0.1;
    }
    yMin = pow(xMax_local,__y);
    xTry = pow(xMax,__y);
  }
  this = RandomGen::rndm();
  dVar1 = RandomGen::rand_uniform(this);
  local_38 = pow((yMin - xTry) * dVar1 + xTry,1.0 / __y);
  if (local_38 < xMax_local) {
    local_38 = xMax_local;
  }
  if (xMax < local_38) {
    local_38 = xMax;
  }
  return local_38;
}

Assistant:

double TestSpectra::PowLawFit_spectrum( //OK for LZ AmBe (Yongheng)
		    double xMin, double xMax, double expo) {
  double yMax, yMin; ++expo;
  if ( expo < 0. ) {
    if ( xMin <= 0. ) xMin = 0.1; //100 eV
    yMax = pow(xMin,expo);
    yMin = pow(xMax,expo);
  }
  else {
    yMax = pow(xMax,expo);
    yMin = pow(xMin,expo);
  }
  double xTry = pow(yMin+(yMax-yMin)*RandomGen::rndm()->rand_uniform(),1./expo);
  if ( xTry < xMin ) xTry = xMin;
  if ( xTry > xMax ) xTry = xMax; //these can create pileup
  return xTry;
}